

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O1

void __thiscall
CheckedSharedMutexTest_RecurseLockShared_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_RecurseLockShared_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  bool *pbVar1;
  DeathTest *pDVar2;
  DeathTest *pDVar3;
  bool bVar4;
  int iVar5;
  char *message;
  StringLike<const_char_*> *regex;
  DeathTest *gtest_dt;
  TrueWithString gtest_msg;
  TypeParam mtx;
  DeathTest *local_120;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_118;
  undefined8 uStack_100;
  AssertHelper local_e8 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  shared_mutex_base<yamc::rwlock::ReaderPrefer> local_b0;
  
  yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_mutex
            ((basic_shared_mutex<yamc::rwlock::ReaderPrefer> *)&local_b0);
  pbVar1 = &local_118.impl_.full_match_;
  uStack_100 = 0;
  local_118.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118.impl_.full_match_ = false;
  local_118.impl_._17_7_ = 0;
  local_118.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)pbVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared(&local_b0);
  }
  if (local_118.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_118.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_e8[0].data_ = (AssertHelperData *)0x1cfcb9;
    testing::ContainsRegex<char_const*>(&local_118,(testing *)local_e8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c8,(PolymorphicMatcher *)&local_118);
    if (local_118.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("mtx.lock_shared()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0x124,&local_120);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c8);
    pDVar2 = local_120;
    iVar5 = 3;
    if (bVar4) {
      if (local_120 != (DeathTest *)0x0) {
        iVar5 = (*local_120->_vptr_DeathTest[2])(local_120);
        pDVar3 = local_120;
        if (iVar5 == 0) {
          testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_118,6);
          iVar5 = (*local_120->_vptr_DeathTest[3])();
          bVar4 = testing::KilledBySignal::operator()((KilledBySignal *)&local_118,iVar5);
          iVar5 = (*pDVar3->_vptr_DeathTest[4])(pDVar3,(ulong)bVar4);
          if ((char)iVar5 != '\0') goto LAB_0018beb9;
          iVar5 = 3;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared
                        (&local_b0);
            }
            (*local_120->_vptr_DeathTest[5])(local_120,2);
            (*pDVar3->_vptr_DeathTest[5])(pDVar3,0);
          }
LAB_0018beb9:
          iVar5 = 0;
          bVar4 = true;
        }
        (*pDVar2->_vptr_DeathTest[1])(pDVar2);
        if (!bVar4) goto LAB_0018becc;
      }
      iVar5 = 0;
    }
LAB_0018becc:
    if (iVar5 != 0) {
      if (iVar5 != 3) goto LAB_0018bf71;
      goto LAB_0018bed9;
    }
  }
  else {
LAB_0018bed9:
    testing::Message::Message((Message *)&local_118);
    message = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x124,message);
    testing::internal::AssertHelper::operator=(local_e8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    if (local_118.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)((local_118.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->pattern_ + 8))();
    }
  }
  uStack_100 = 0;
  local_118.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118.impl_.full_match_ = false;
  local_118.impl_._17_7_ = 0;
  local_118.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)pbVar1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared(&local_b0);
  }
  if (local_118.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_118.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
LAB_0018bf71:
  yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_mutex
            ((basic_shared_mutex<yamc::rwlock::ReaderPrefer> *)&local_b0);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, RecurseLockShared) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock_shared());
  EXPECT_CHECK_FAILURE(mtx.lock_shared());
  ASSERT_NO_THROW(mtx.unlock_shared());
}